

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixWritableFile::Sync(PosixWritableFile *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int *piVar5;
  long in_RSI;
  char *__s;
  Slice local_78;
  Slice local_68;
  char local_58 [16];
  string dir;
  
  __s = *(char **)(in_RSI + 8);
  pcVar4 = strrchr(__s,0x2f);
  local_78.data_ = "";
  local_78.size_ = 0;
  dir._M_dataplus._M_p = (pointer)&dir.field_2;
  dir._M_string_length = 0;
  dir.field_2._M_local_buf[0] = '\0';
  if (pcVar4 == (char *)0x0) {
    std::__cxx11::string::assign((char *)&dir);
  }
  else {
    local_68.data_ = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,pcVar4);
    std::__cxx11::string::operator=((string *)&dir,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    __s = pcVar4 + 1;
  }
  local_78.size_ = strlen(__s);
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  local_68.data_ = "MANIFEST";
  local_68.size_ = 8;
  local_78.data_ = __s;
  bVar1 = Slice::starts_with(&local_78,&local_68);
  if (bVar1) {
    iVar2 = open(dir._M_dataplus._M_p,0);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      IOError((anon_unknown_1 *)&local_68,&dir,*piVar5);
      Status::operator=((Status *)this,(Status *)&local_68);
      Status::~Status((Status *)&local_68);
    }
    else {
      iVar3 = fsync(iVar2);
      if (iVar3 < 0) {
        piVar5 = __errno_location();
        IOError((anon_unknown_1 *)&local_68,&dir,*piVar5);
        Status::operator=((Status *)this,(Status *)&local_68);
        Status::~Status((Status *)&local_68);
      }
      close(iVar2);
    }
  }
  std::__cxx11::string::~string((string *)&dir);
  if ((this->super_WritableFile)._vptr_WritableFile == (_func_int **)0x0) {
    iVar2 = fflush_unlocked(*(FILE **)(in_RSI + 0x28));
    if (iVar2 == 0) {
      iVar2 = fileno(*(FILE **)(in_RSI + 0x28));
      iVar2 = fdatasync(iVar2);
      if (iVar2 == 0) {
        return (Status)(char *)this;
      }
    }
    dir._M_dataplus._M_p = *(pointer *)(in_RSI + 8);
    dir._M_string_length = *(size_type *)(in_RSI + 0x10);
    piVar5 = __errno_location();
    local_68.data_ = strerror(*piVar5);
    local_68.size_ = strlen(local_68.data_);
    Status::IOError((Status *)&local_78,(Slice *)&dir,&local_68);
    Status::operator=((Status *)this,(Status *)&local_78);
    Status::~Status((Status *)&local_78);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Sync() {
                // Ensure new files referred to by the manifest are in the filesystem.
                Status s = SyncDirIfManifest();
                if (!s.ok()) {
                    return s;
                }
                if (fflush_unlocked(file_) != 0 ||
                    fdatasync(fileno(file_)) != 0) {
                    s = Status::IOError(filename_, strerror(errno));
                }
                return s;
            }